

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

void immutable::rrb_details::promote_rightmost_leaf<int,false,6>
               (ref<immutable::rrb<int,_false,_6>_> *new_rrb)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  internal_node<int,_false> *piVar3;
  rrb_size_table<false> *prVar4;
  internal_node<int,_false> *piVar5;
  char *__function;
  ulong uVar6;
  rrb<int,_false,_6> *prVar7;
  ref<immutable::rrb_details::internal_node<int,_false>_> *prVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ref<immutable::rrb_details::internal_node<int,_false>_> path [7];
  ref<immutable::rrb_details::internal_node<int,_false>_> local_90;
  ref<immutable::rrb_details::internal_node<int,_false>_> *local_88;
  undefined8 uStack_80;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_78 [8];
  ref<immutable::rrb<int,_false,_6>_> *local_38;
  
  local_78[4].ptr = (internal_node<int,_false> *)0x0;
  local_78[5].ptr = (internal_node<int,_false> *)0x0;
  local_78[2].ptr = (internal_node<int,_false> *)0x0;
  local_78[3].ptr = (internal_node<int,_false> *)0x0;
  local_78[0].ptr = (internal_node<int,_false> *)0x0;
  local_78[1].ptr = (internal_node<int,_false> *)0x0;
  local_78[6].ptr = (internal_node<int,_false> *)0x0;
  if (new_rrb->ptr != (rrb<int,_false,_6> *)0x0) {
    ref<immutable::rrb_details::internal_node<int,false>>::operator=
              ((ref<immutable::rrb_details::internal_node<int,false>> *)local_78,&new_rrb->ptr->root
              );
    prVar7 = new_rrb->ptr;
    if (prVar7 != (rrb<int,_false,_6> *)0x0) {
      uVar10 = 0;
      uVar11 = 0xfffffffa;
      do {
        prVar8 = local_78 + uVar10;
        uVar11 = uVar11 + 6;
        if (prVar7->shift <= uVar11) {
          ref<immutable::rrb_details::leaf_node<int,false>>::operator=
                    ((ref<immutable::rrb_details::leaf_node<int,false>> *)&prVar7->tail,prVar8);
          if (prVar8->ptr == (internal_node<int,_false> *)0x0) goto LAB_001453b5;
          if (new_rrb->ptr != (rrb<int,_false,_6> *)0x0) {
            uStack_80._4_4_ = prVar8->ptr->len;
            new_rrb->ptr->tail_len = uStack_80._4_4_;
            local_90.ptr = (internal_node<int,_false> *)0x0;
            ref<immutable::rrb_details::internal_node<int,_false>_>::operator=(prVar8,&local_90);
            release<int>(local_90.ptr);
            if (uVar10 == 0) goto LAB_00145346;
            local_38 = new_rrb;
            goto LAB_0014508a;
          }
          break;
        }
        piVar3 = prVar8->ptr;
        if (piVar3 == (internal_node<int,_false> *)0x0) goto LAB_001453b5;
        uVar10 = (ulong)((int)uVar10 + 1);
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  (local_78 + uVar10,piVar3->child + (piVar3->len - 1));
        prVar7 = new_rrb->ptr;
      } while (prVar7 != (rrb<int,_false,_6> *)0x0);
    }
  }
  goto LAB_00145014;
LAB_001453b5:
  __function = 
  "T *immutable::ref<immutable::rrb_details::internal_node<int, false>>::operator->() const [T = immutable::rrb_details::internal_node<int, false>]"
  ;
  goto LAB_001453ca;
LAB_0014508a:
  do {
    new_rrb = local_38;
    uVar6 = uVar10 - 1;
    prVar8 = local_78 + uVar6;
    if (local_78[uVar10].ptr == (internal_node<int,_false> *)0x0) {
      piVar3 = local_78[uVar6].ptr;
      if (piVar3 == (internal_node<int,_false> *)0x0) goto LAB_001453b5;
      uVar2 = piVar3->len;
      if (uVar2 == 1) {
        local_90.ptr = (internal_node<int,_false> *)0x0;
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=(prVar8,&local_90);
        release<int>(local_90.ptr);
      }
      else {
        if ((uVar6 == 0) && (uVar2 == 2)) {
          ref<immutable::rrb_details::internal_node<int,_false>_>::operator=(prVar8,piVar3->child);
          if (new_rrb->ptr == (rrb<int,_false,_6> *)0x0) goto LAB_00145014;
          puVar1 = &new_rrb->ptr->shift;
          *puVar1 = *puVar1 - 6;
          break;
        }
        local_88 = prVar8;
        piVar5 = (internal_node<int,_false> *)malloc((ulong)(uVar2 - 1) * 8 + 0x20);
        piVar5->len = uVar2 - 1;
        piVar5->type = INTERNAL_NODE;
        (piVar5->size_table).ptr = (rrb_size_table<false> *)0x0;
        ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                  (&piVar5->size_table,&piVar3->size_table);
        piVar5->child = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(piVar5 + 1);
        uVar11 = piVar5->len;
        memset(piVar5 + 1,0,(ulong)uVar11 * 8);
        if ((ulong)uVar11 != 0) {
          lVar9 = 0;
          uVar10 = 0;
          do {
            ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                      ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                       ((long)&piVar5->child->ptr + lVar9),
                       (ref<immutable::rrb_details::internal_node<int,_false>_> *)
                       ((long)&piVar3->child->ptr + lVar9));
            uVar10 = uVar10 + 1;
            lVar9 = lVar9 + 8;
          } while (uVar10 < piVar5->len);
        }
        piVar5->guid = 0;
        piVar5->_ref_count = 1;
        local_90.ptr = piVar5;
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=(local_88,&local_90);
        release<int>(local_90.ptr);
      }
    }
    else {
      piVar3 = local_78[uVar6].ptr;
      uVar11 = piVar3->len;
      local_88 = prVar8;
      piVar5 = (internal_node<int,_false> *)malloc((ulong)uVar11 * 8 + 0x20);
      piVar5->len = uVar11;
      piVar5->type = INTERNAL_NODE;
      (piVar5->size_table).ptr = (rrb_size_table<false> *)0x0;
      ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                (&piVar5->size_table,&piVar3->size_table);
      piVar5->guid = 0;
      piVar5->child = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(piVar5 + 1);
      uVar11 = piVar3->len;
      memset(piVar5 + 1,0,(ulong)uVar11 * 8);
      if ((ulong)uVar11 != 0) {
        lVar9 = 0;
        uVar12 = 0;
        do {
          ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                    ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                     ((long)&piVar5->child->ptr + lVar9),
                     (ref<immutable::rrb_details::internal_node<int,_false>_> *)
                     ((long)&piVar3->child->ptr + lVar9));
          uVar12 = uVar12 + 1;
          lVar9 = lVar9 + 8;
        } while (uVar12 < piVar3->len);
      }
      prVar8 = local_88;
      piVar5->_ref_count = 1;
      local_90.ptr = piVar5;
      ref<immutable::rrb_details::internal_node<int,_false>_>::operator=(local_88,&local_90);
      release<int>(local_90.ptr);
      piVar3 = prVar8->ptr;
      if (piVar3 == (internal_node<int,_false> *)0x0) goto LAB_001453b5;
      ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                (piVar3->child + (piVar3->len - 1),local_78 + uVar10);
      piVar3 = prVar8->ptr;
      if (piVar3 == (internal_node<int,_false> *)0x0) goto LAB_001453b5;
      prVar4 = (piVar3->size_table).ptr;
      if (prVar4 != (rrb_size_table<false> *)0x0) {
        uVar11 = piVar3->len;
        piVar5 = (internal_node<int,_false> *)malloc((ulong)uVar11 * 4 + 0x10);
        *(ref<immutable::rrb_details::rrb_size_table<false>_> **)piVar5 = &piVar5->size_table;
        memcpy(&piVar5->size_table,prVar4->size,(ulong)uVar11 << 2);
        piVar5->guid = 0;
        piVar5->_ref_count = 1;
        local_90.ptr = piVar5;
        ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                  (&piVar3->size_table,
                   (ref<immutable::rrb_details::rrb_size_table<false>_> *)&local_90);
        prVar8 = local_88;
        if ((local_90.ptr != (internal_node<int,_false> *)0x0) &&
           (uVar2 = (local_90.ptr)->_ref_count, (local_90.ptr)->_ref_count = uVar2 - 1, uVar2 == 1))
        {
          free(local_90.ptr);
        }
        piVar3 = prVar8->ptr;
        if (piVar3 == (internal_node<int,_false> *)0x0) goto LAB_001453b5;
        prVar4 = (piVar3->size_table).ptr;
        if (prVar4 == (rrb_size_table<false> *)0x0) {
          __function = 
          "T *immutable::ref<immutable::rrb_details::rrb_size_table<false>>::operator->() const [T = immutable::rrb_details::rrb_size_table<false>]"
          ;
          goto LAB_001453ca;
        }
        puVar1 = prVar4->size + (piVar3->len - 1);
        *puVar1 = *puVar1 - uStack_80._4_4_;
      }
    }
    uVar10 = uVar6;
    new_rrb = local_38;
  } while (uVar6 != 0);
LAB_00145346:
  prVar7 = new_rrb->ptr;
  if (prVar7 != (rrb<int,_false,_6> *)0x0) {
    if (local_78[0].ptr != (internal_node<int,_false> *)0x0) {
      (local_78[0].ptr)->_ref_count = (local_78[0].ptr)->_ref_count + 1;
    }
    local_90.ptr = (internal_node<int,_false> *)(prVar7->root).ptr;
    (prVar7->root).ptr = (tree_node<int,_false> *)local_78[0].ptr;
    ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
              ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_90);
    lVar9 = 0x38;
    do {
      release<int>(*(internal_node<int,_false> **)((long)&local_78[-1].ptr + lVar9));
      lVar9 = lVar9 + -8;
    } while (lVar9 != 0);
    return;
  }
LAB_00145014:
  __function = 
  "T *immutable::ref<immutable::rrb<int, false, 6>>::operator->() const [T = immutable::rrb<int, false, 6>]"
  ;
LAB_001453ca:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

ref<T>::ref(T* p) : ptr(p)
      {
      if (ptr)
        ptr->_ref_count = 1;
      }